

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O2

void __thiscall tonk::RefCounter::AppRelease(RefCounter *this)

{
  ErrorResult *pEVar1;
  allocator local_39;
  Result local_38;
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,"Application requested shutdown",&local_39);
  pEVar1 = (ErrorResult *)operator_new(0x38);
  pEVar1->Source = "AppRelease";
  std::__cxx11::string::string((string *)&pEVar1->Description,local_30);
  pEVar1->Type = Tonk;
  pEVar1->Code = 0xc;
  local_38.Error = pEVar1;
  StartShutdown(this,0xc,&local_38);
  Result::~Result(&local_38);
  std::__cxx11::string::~string(local_30);
  LOCK();
  (this->AppHoldsReference)._M_base._M_i = false;
  UNLOCK();
  return;
}

Assistant:

void RefCounter::AppRelease()
{
    // Begin disconnect if it has not happened yet
    StartShutdown(
        Tonk_AppRequest,
        Result("AppRelease", "Application requested shutdown", ErrorType::Tonk, Tonk_AppRequest));

    AppHoldsReference = false;
}